

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void prepare_close_job_string
               (cio_websocket *websocket,cio_websocket_status_code status_code,char *reason,
               cio_websocket_write_handler_t handler,void *handler_context,
               cio_buffered_stream_write_handler_t stream_handler)

{
  cio_response_buffer *pcVar1;
  cio_write_buffer *pcVar2;
  uint16_t uVar3;
  size_t sVar4;
  size_t __n;
  size_t sVar5;
  
  if (reason == (char *)0x0) {
    uVar3 = cio_htobe16((uint16_t)status_code);
    *(uint16_t *)(websocket->ws_private).close_buffer.buffer = uVar3;
    sVar5 = 2;
  }
  else {
    sVar4 = strlen(reason);
    uVar3 = cio_htobe16((uint16_t)status_code);
    *(uint16_t *)(websocket->ws_private).close_buffer.buffer = uVar3;
    __n = 0x7b;
    if (sVar4 < 0x7b) {
      __n = sVar4;
    }
    memcpy((websocket->ws_private).close_buffer.buffer + 2,reason,__n);
    sVar5 = __n + 2;
  }
  pcVar1 = &(websocket->ws_private).close_buffer;
  pcVar2 = &(websocket->ws_private).close_buffer.write_buffer;
  (websocket->ws_private).close_buffer.write_buffer.data.head.q_len =
       (size_t)(websocket->ws_private).close_buffer.buffer;
  (websocket->ws_private).close_buffer.write_buffer.data.element.length = sVar5;
  (websocket->ws_private).close_buffer.write_buffer.next = &pcVar1->wb_head;
  (websocket->ws_private).close_buffer.write_buffer.prev = &pcVar1->wb_head;
  (websocket->ws_private).close_buffer.wb_head.next = pcVar2;
  (websocket->ws_private).close_buffer.wb_head.prev = pcVar2;
  (websocket->ws_private).close_buffer.wb_head.data.head.q_len = 1;
  (websocket->ws_private).close_buffer.wb_head.data.element.length = sVar5;
  (websocket->ws_private).write_close_job.wbh = &pcVar1->wb_head;
  (websocket->ws_private).write_close_job.handler = handler;
  (websocket->ws_private).write_close_job.handler_context = handler_context;
  (websocket->ws_private).write_close_job.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
  (websocket->ws_private).write_close_job.last_frame = true;
  (websocket->ws_private).write_close_job.stream_handler = stream_handler;
  return;
}

Assistant:

static void prepare_close_job_string(struct cio_websocket *websocket, enum cio_websocket_status_code status_code, const char *reason, cio_websocket_write_handler_t handler, void *handler_context, cio_buffered_stream_write_handler_t stream_handler)
{
	size_t length = 0;

	if (reason != NULL) {
		length = strlen(reason);
	}

	prepare_close_job(websocket, status_code, (const uint8_t *)reason, length, handler, handler_context, stream_handler);
}